

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  exception *e;
  char **argv_local;
  int argc_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"---- string conversion");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  string_conversion_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- os wrapper");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  os_wrapper_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- fopen");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  fopen_wrapper_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- getenv");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  getenv_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- utf8");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  to_utf8_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- utf16");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  to_utf16_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- utf8_to_ascii");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  utf8_to_ascii_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- transcoding");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  transcoding_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- whoami");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  get_whoami_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- file");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  same_file_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- path");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  path_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- read from file");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  read_from_file_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- hex encode/decode");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  hex_encode_decode_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- rename/delete");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  rename_delete_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- timestamp");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  timestamp_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- is_long_long");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  is_long_long_test();
  poVar1 = std::operator<<((ostream *)&std::cout,"---- memory usage");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  memory_usage_test();
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    try {
        std::cout << "---- string conversion" << std::endl;
        string_conversion_test();
        std::cout << "---- os wrapper" << std::endl;
        os_wrapper_test();
        std::cout << "---- fopen" << std::endl;
        fopen_wrapper_test();
        std::cout << "---- getenv" << std::endl;
        getenv_test();
        std::cout << "---- utf8" << std::endl;
        to_utf8_test();
        std::cout << "---- utf16" << std::endl;
        to_utf16_test();
        std::cout << "---- utf8_to_ascii" << std::endl;
        utf8_to_ascii_test();
        std::cout << "---- transcoding" << std::endl;
        transcoding_test();
        std::cout << "---- whoami" << std::endl;
        get_whoami_test();
        std::cout << "---- file" << std::endl;
        same_file_test();
        std::cout << "---- path" << std::endl;
        path_test();
        std::cout << "---- read from file" << std::endl;
        read_from_file_test();
        std::cout << "---- hex encode/decode" << std::endl;
        hex_encode_decode_test();
        std::cout << "---- rename/delete" << std::endl;
        rename_delete_test();
        std::cout << "---- timestamp" << std::endl;
        timestamp_test();
        std::cout << "---- is_long_long" << std::endl;
        is_long_long_test();
        std::cout << "---- memory usage" << std::endl;
        memory_usage_test();
    } catch (std::exception& e) {
        std::cout << "unexpected exception: " << e.what() << std::endl;
    }

    return 0;
}